

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O1

int qtree_decode64(uchar *infile,LONGLONG *a,int n,int nqx,int nqy,int nbitplanes)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uchar *a_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int nx;
  int iVar7;
  int ny;
  int iVar8;
  char *err_message;
  int iVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  
  iVar4 = nqy;
  if (nqy < nqx) {
    iVar4 = nqx;
  }
  dVar12 = log((double)iVar4);
  iVar7 = (int)(dVar12 / 0.6931471805599453 + 0.5);
  bVar1 = 1 << ((byte)iVar7 & 0x1f) < iVar4;
  iVar11 = (nqx - (nqx + 1 >> 0x1f)) + 1 >> 1;
  iVar4 = (nqy - (nqy + 1 >> 0x1f)) + 1 >> 1;
  a_00 = (uchar *)malloc((long)iVar4 * (long)iVar11);
  if (a_00 == (uchar *)0x0) {
    err_message = "qtree_decode64: insufficient memory";
LAB_0017aba6:
    ffpmsg(err_message);
    iVar4 = 0x19e;
  }
  else {
    if (0 < nbitplanes) {
      iVar5 = (uint)bVar1 + iVar7;
      do {
        iVar3 = input_nybble(infile);
        if (iVar3 == 0xf) {
          iVar3 = input_huffman(infile);
          *a_00 = (uchar)iVar3;
          if (1 < iVar5) {
            ny = 1;
            nx = 1;
            iVar3 = (uint)bVar1 + iVar7 + -1;
            iVar10 = 1 << ((byte)iVar5 & 0x1f);
            iVar8 = nqy;
            iVar9 = nqx;
            do {
              iVar10 = iVar10 >> 1;
              iVar6 = iVar10;
              if (iVar9 <= iVar10) {
                iVar6 = 0;
              }
              nx = nx * 2 - (uint)(iVar9 <= iVar10);
              iVar9 = iVar9 - iVar6;
              iVar6 = iVar10;
              if (iVar8 <= iVar10) {
                iVar6 = 0;
              }
              ny = ny * 2 - (uint)(iVar8 <= iVar10);
              iVar8 = iVar8 - iVar6;
              qtree_expand(infile,a_00,nx,ny,a_00);
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
        }
        else {
          if (iVar3 != 0) {
            err_message = "qtree_decode64: bad format code";
            goto LAB_0017aba6;
          }
          input_nnybble(infile,iVar4 * iVar11,a_00);
        }
        qtree_bitins64(a_00,nqx,nqy,a,n,nbitplanes + -1);
        bVar2 = 1 < nbitplanes;
        nbitplanes = nbitplanes + -1;
      } while (bVar2);
    }
    free(a_00);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
qtree_decode64(unsigned char *infile, LONGLONG a[], int n, int nqx, int nqy, int nbitplanes)

/*
char *infile;
LONGLONG a[];				 a is 2-D array with dimensions (n,n)	
int n;					 length of full row in a				
int nqx;				 partial length of row to decode		
int nqy;				 partial length of column (<=n)		
int nbitplanes;				 number of bitplanes to decode		
*/
{
int log2n, k, bit, b, nqmax;
int nx,ny,nfx,nfy,c;
int nqx2, nqy2;
unsigned char *scratch;

	/*
	 * log2n is log2 of max(nqx,nqy) rounded up to next power of 2
	 */
	nqmax = (nqx>nqy) ? nqx : nqy;
	log2n = (int) (log((float) nqmax)/log(2.0)+0.5);
	if (nqmax > (1<<log2n)) {
		log2n += 1;
	}
	/*
	 * allocate scratch array for working space
	 */
	nqx2=(nqx+1)/2;
	nqy2=(nqy+1)/2;
	scratch = (unsigned char *) malloc((size_t)nqx2*nqy2);
	if (scratch == (unsigned char *) NULL) {
		ffpmsg("qtree_decode64: insufficient memory");
		return(DATA_DECOMPRESSION_ERR);
	}
	/*
	 * now decode each bit plane, starting at the top
	 * A is assumed to be initialized to zero
	 */
	for (bit = nbitplanes-1; bit >= 0; bit--) {
		/*
		 * Was bitplane was quadtree-coded or written directly?
		 */
		b = input_nybble(infile);

		if(b == 0) {
			/*
			 * bit map was written directly
			 */
			read_bdirect64(infile,a,n,nqx,nqy,scratch,bit);
		} else if (b != 0xf) {
			ffpmsg("qtree_decode64: bad format code");
			return(DATA_DECOMPRESSION_ERR);
		} else {
			/*
			 * bitmap was quadtree-coded, do log2n expansions
			 *
			 * read first code
			 */
			scratch[0] = input_huffman(infile);
			/*
			 * now do log2n expansions, reading codes from file as necessary
			 */
			nx = 1;
			ny = 1;
			nfx = nqx;
			nfy = nqy;
			c = 1<<log2n;
			for (k = 1; k<log2n; k++) {
				/*
				 * this somewhat cryptic code generates the sequence
				 * n[k-1] = (n[k]+1)/2 where n[log2n]=nqx or nqy
				 */
				c = c>>1;
				nx = nx<<1;
				ny = ny<<1;
				if (nfx <= c) { nx -= 1; } else { nfx -= c; }
				if (nfy <= c) { ny -= 1; } else { nfy -= c; }
				qtree_expand(infile,scratch,nx,ny,scratch);
			}
			/*
			 * now copy last set of 4-bit codes to bitplane bit of array a
			 */
			qtree_bitins64(scratch,nqx,nqy,a,n,bit);
		}
	}
	free(scratch);
	return(0);
}